

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit-pxr-compat-api.cc
# Opt level: O0

void pxr_compat_api_test(void)

{
  allocator local_81;
  string local_80 [32];
  undefined1 local_60 [8];
  UsdStageRefPtr ref_1;
  allocator local_39;
  string local_38 [32];
  undefined1 local_18 [8];
  UsdStageRefPtr ref;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"creat.usda",&local_39);
  pxr::UsdStage::CreateNew((string *)local_18,(InitialLoadSet)local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::shared_ptr<pxr::UsdStage>::~shared_ptr((shared_ptr<pxr::UsdStage> *)local_18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"input.usda",&local_81);
  pxr::UsdStage::Open((string *)local_60,(InitialLoadSet)local_80);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::shared_ptr<pxr::UsdStage>::~shared_ptr((shared_ptr<pxr::UsdStage> *)local_60);
  return;
}

Assistant:

void pxr_compat_api_test(void) {
  {
    auto ref = UsdStage::CreateNew("creat.usda");
  }

  {
    auto ref = UsdStage::Open("input.usda");
  }

}